

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound_Queue.cpp
# Opt level: O2

int __thiscall Sound_Queue::init(Sound_Queue *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  sample_t *psVar2;
  SDL_sem *pSVar3;
  char *pcVar4;
  SDL_AudioSpec as;
  
  if (this->bufs != (sample_t *)0x0) {
    __assert_fail("!bufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/Sound_Queue.cpp"
                  ,0x41,"const char *Sound_Queue::init(long, int)");
  }
  psVar2 = (sample_t *)operator_new__(0x3000);
  this->bufs = psVar2;
  if (this->bufs == (sample_t *)0x0) {
    iVar1 = 0x114544;
  }
  else {
    pSVar3 = (SDL_sem *)SDL_CreateSemaphore(2);
    this->free_sem = pSVar3;
    if (this->free_sem == (SDL_sem *)0x0) {
      pcVar4 = sdl_error("Couldn\'t create semaphore");
      return (int)pcVar4;
    }
    as.freq = (int)ctx;
    as.format = 0x8010;
    as.silence = '\0';
    as.samples = 0x800;
    as.size = 0;
    as.callback = fill_buffer_;
    as.userdata = this;
    iVar1 = SDL_OpenAudio(&as,0);
    if (iVar1 < 0) {
      pcVar4 = sdl_error("Couldn\'t open SDL audio");
      iVar1 = (int)pcVar4;
    }
    else {
      iVar1 = 0;
      SDL_PauseAudio(0);
      this->sound_open = true;
    }
  }
  return iVar1;
}

Assistant:

const char* Sound_Queue::init( long sample_rate, int chan_count )
{
	assert( !bufs ); // can only be initialized once
	
	bufs = new sample_t [(long) buf_size * buf_count];
	if ( !bufs )
		return "Out of memory";
	
	free_sem = SDL_CreateSemaphore( buf_count - 1 );
	if ( !free_sem )
		return sdl_error( "Couldn't create semaphore" );
	
	SDL_AudioSpec as;
	as.freq = sample_rate;
	as.format = AUDIO_S16SYS;
	as.channels = chan_count;
	as.silence = 0;
	as.samples = buf_size;
	as.size = 0;
	as.callback = fill_buffer_;
	as.userdata = this;
	if ( SDL_OpenAudio( &as, NULL ) < 0 )
		return sdl_error( "Couldn't open SDL audio" );
	SDL_PauseAudio( false );
	sound_open = true;
	
	return NULL;
}